

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsFoldableByFoldScalar(Instruction *this)

{
  bool bVar1;
  uint32_t id;
  InstructionFolder *this_00;
  DefUseManager *this_01;
  Instruction *type_inst;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this_00 = IRContext::get_instruction_folder(this->context_);
  bVar1 = InstructionFolder::IsFoldableOpcode(this_00,this->opcode_);
  if (bVar1) {
    this_01 = IRContext::get_def_use_mgr(this->context_);
    id = type_id(this);
    type_inst = analysis::DefUseManager::GetDef(this_01,id);
    bVar1 = InstructionFolder::IsFoldableScalarType(this_00,type_inst);
    if (bVar1) {
      local_20 = std::
                 _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.cpp:772:29)>
                 ::_M_invoke;
      local_28 = std::
                 _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.cpp:772:29)>
                 ::_M_manager;
      local_38._M_unused._M_object = this_00;
      local_38._8_8_ = this;
      bVar1 = WhileEachInOperand(this,(function<bool_(const_unsigned_int_*)> *)&local_38);
      if (local_28 == (code *)0x0) {
        return bVar1;
      }
      (*local_28)(&local_38,&local_38,__destroy_functor);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Instruction::IsFoldableByFoldScalar() const {
  const InstructionFolder& folder = context()->get_instruction_folder();
  if (!folder.IsFoldableOpcode(opcode())) {
    return false;
  }

  Instruction* type = context()->get_def_use_mgr()->GetDef(type_id());
  if (!folder.IsFoldableScalarType(type)) {
    return false;
  }

  // Even if the type of the instruction is foldable, its operands may not be
  // foldable (e.g., comparisons of 64bit types).  Check that all operand types
  // are foldable before accepting the instruction.
  return WhileEachInOperand([&folder, this](const uint32_t* op_id) {
    Instruction* def_inst = context()->get_def_use_mgr()->GetDef(*op_id);
    Instruction* def_inst_type =
        context()->get_def_use_mgr()->GetDef(def_inst->type_id());
    return folder.IsFoldableScalarType(def_inst_type);
  });
}